

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

void * compress_thread(void *pargs)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  ssize_t rd;
  uchar out [32768];
  uchar in [32768];
  uchar *local_90;
  z_stream strm;
  uint have;
  int ret;
  args_t *args;
  void *pargs_local;
  
  strm.state = (internal_state *)0x0;
  strm.zalloc = (alloc_func)0x0;
  strm.zfree = (free_func)0x0;
  strm.reserved._4_4_ = deflateInit_(&local_90,0xffffffff,"1.2.11",0x70);
  if (strm.reserved._4_4_ == 0) {
    do {
      sVar2 = read_block(*pargs,out + 0x7ff8,0x8000);
      strm.next_in._0_4_ = (int)sVar2;
      if (sVar2 < 0) {
        fprintf(_stderr,"error reading\n");
        goto LAB_00103138;
      }
      local_90 = out + 0x7ff8;
      do {
        strm.next_out._0_4_ = 0x8000;
        strm.total_in = (uLong)&rd;
        strm.reserved._4_4_ = deflate(&local_90,0);
        if (strm.reserved._4_4_ == -2) {
          fprintf(_stderr,"zlib internal error\n");
          goto LAB_00103138;
        }
        strm.reserved._0_4_ = 0x8000 - (int)strm.next_out;
        sVar3 = write_block(*(int *)((long)pargs + 4),&rd,(ulong)(uint)strm.reserved);
        if (sVar3 < (long)(ulong)(uint)strm.reserved) {
          fprintf(_stderr,"error writing\n");
          goto LAB_00103138;
        }
      } while ((int)strm.next_out == 0);
      if ((int)strm.next_in != 0) {
        fprintf(_stderr,"zlib internal error\n");
        goto LAB_00103138;
      }
    } while (0 < sVar2);
    iVar1 = deflate(&local_90,4);
    if (iVar1 == -2) {
      fprintf(_stderr,"zlib internal error\n");
    }
    else {
      strm.reserved._0_4_ = 0x8000 - (int)strm.next_out;
      sVar2 = write_block(*(int *)((long)pargs + 4),&rd,(ulong)(uint)strm.reserved);
      if (sVar2 < (long)(ulong)(uint)strm.reserved) {
        fprintf(_stderr,"error writing\n");
      }
      else {
        deflateEnd(&local_90);
      }
    }
  }
  else {
    fprintf(_stderr,"error init zlib\n");
  }
LAB_00103138:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *compress_thread(void *pargs) {
  args_t *args = (args_t *)pargs;

  int ret;
  unsigned have;
  z_stream strm;
  unsigned char in[PSVIMG_BLOCK_SIZE];
  unsigned char out[PSVIMG_BLOCK_SIZE];
  ssize_t rd;

  /* allocate deflate state */
  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, Z_DEFAULT_COMPRESSION);
  if (ret != Z_OK) {
    fprintf(stderr, "error init zlib\n");
    goto end;
  }

  /* compress until end of file */
  do {
    strm.avail_in = rd = read_block(args->in, in, sizeof(in));
    if (rd < 0) {
      fprintf(stderr, "error reading\n");
      goto end;
    }
    strm.next_in = in;

    /* run deflate() on input until output buffer not full, finish
       compression if all of source has been read in */
    do {
      strm.avail_out = PSVIMG_BLOCK_SIZE;
      strm.next_out = out;
      ret = deflate(&strm, Z_NO_FLUSH);    /* no bad return value */
      if (ret == Z_STREAM_ERROR) {  /* state not clobbered */
        fprintf(stderr, "zlib internal error\n");
        goto end;
      }
      have = PSVIMG_BLOCK_SIZE - strm.avail_out;
      if (write_block(args->out, out, have) < have) {
        fprintf(stderr, "error writing\n");
        goto end;
      }
    } while (strm.avail_out == 0);
    if (strm.avail_in != 0){     /* all input will be used */
      fprintf(stderr, "zlib internal error\n");
      goto end;
    }

    /* done when last data in file processed */
  } while (rd > 0);
  if (deflate(&strm, Z_FINISH) == Z_STREAM_ERROR) {  /* state not clobbered */
    fprintf(stderr, "zlib internal error\n");
    goto end;
  }
  have = PSVIMG_BLOCK_SIZE - strm.avail_out;
  if (write_block(args->out, out, have) < have) {
    fprintf(stderr, "error writing\n");
    goto end;
  }

  /* clean up and return */
  (void)deflateEnd(&strm);

end:
  close(args->out);
  close(args->in);
  return NULL;
}